

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,Options *options,GeneratorContext *generator_context
          ,string *error)

{
  long lVar1;
  ServiceDescriptor *this_00;
  MethodDescriptor *this_01;
  size_t sVar2;
  void *pvVar3;
  _Base_ptr size;
  _Base_ptr size_00;
  Rep *pRVar4;
  _anonymous_namespace_ *__n;
  string *full_name;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [8];
  Options *options_00;
  bool bVar8;
  int iVar9;
  int iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  FileDescriptorProto *pFVar15;
  FileDescriptor *pFVar16;
  long *plVar17;
  Descriptor *pDVar18;
  char *pcVar19;
  Options *pOVar20;
  long lVar21;
  void **ppvVar22;
  long *plVar23;
  bool is_descriptor;
  bool is_descriptor_00;
  bool is_descriptor_01;
  ServiceDescriptor *extraout_RDX;
  ServiceDescriptor *extraout_RDX_00;
  ServiceDescriptor *extraout_RDX_01;
  ServiceDescriptor *extraout_RDX_02;
  ServiceDescriptor *extraout_RDX_03;
  ServiceDescriptor *extraout_RDX_04;
  ServiceDescriptor *extraout_RDX_05;
  ServiceDescriptor *extraout_RDX_06;
  ServiceDescriptor *desc;
  void **ppvVar24;
  pointer pcVar25;
  long lVar26;
  char *pcVar27;
  size_type sVar28;
  void *pvVar29;
  ulong uVar30;
  long lVar31;
  pointer pcVar32;
  bool bVar33;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar34;
  pair<std::_Rb_tree_iterator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::_Rb_tree_iterator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  pVar35;
  string files_data;
  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
  deps;
  FileDescriptor *file_node;
  map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  dependency_count;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  nodes_without_dependency;
  string dependency_filename;
  Printer printer;
  FileDescriptorSet sorted_file_set;
  string fullname;
  string filename;
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  undefined1 local_268 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  Options *local_238;
  undefined1 local_230 [8];
  void *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Base_ptr local_210;
  _Base_ptr local_208;
  _anonymous_namespace_ *local_200;
  _Base_ptr local_1f8;
  FileDescriptor *local_1f0;
  _anonymous_namespace_ *local_1e8;
  undefined1 local_1e0 [32];
  _Base_ptr local_1c0;
  size_t local_1b8;
  Options *local_1b0;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [16];
  _Base_ptr p_Stack_188;
  _Base_ptr local_180;
  size_t local_178;
  string local_170;
  undefined1 local_150 [160];
  undefined1 local_b0 [16];
  RepeatedPtrFieldBase local_a0;
  ZeroCopyOutputStream *local_80;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  undefined1 local_70 [64];
  
  pcVar27 = (char *)error;
  local_238 = options;
  local_1b0 = (Options *)generator_context;
  if (options->is_descriptor == true) {
    sVar2 = (*(undefined8 **)file)[1];
    if ((sVar2 != kDescriptorFile_abi_cxx11_._M_string_length) ||
       ((sVar2 != 0 &&
        (iVar9 = bcmp((void *)**(undefined8 **)file,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                      sVar2), iVar9 != 0)))) {
      pcVar27 = (char *)error->_M_string_length;
      pcVar19 = "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
LAB_00277733:
      std::__cxx11::string::_M_replace((ulong)error,0,pcVar27,(ulong)pcVar19);
      return false;
    }
  }
  else if (file[0x3a] != (FileDescriptor)0x3) {
    pcVar27 = (char *)error->_M_string_length;
    pcVar19 = 
    "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
    ;
    goto LAB_00277733;
  }
  pOVar20 = local_1b0;
  (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
            ((string *)(local_70 + 0x20),(_anonymous_namespace_ *)file,(FileDescriptor *)local_238,
             local_1b0);
  local_80 = (ZeroCopyOutputStream *)
             (**(code **)(*(long *)pOVar20 + 0x10))(pOVar20,(string *)(local_70 + 0x20));
  io::Printer::Printer((Printer *)local_150,local_80,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)local_150,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  anon_unknown_2::FilenameToClassname((string *)local_70,(string *)(local_70 + 0x20));
  iVar9 = std::__cxx11::string::find_last_of(local_70,0x3e4bdf,0xffffffffffffffff);
  if (iVar9 == -1) {
    pOVar20 = (Options *)local_70;
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)local_150,"class ^name^\n{\n",(char (*) [5])0x3f58c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar20);
  }
  else {
    std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_70);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)local_150,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != &local_290) {
      operator_delete((void *)local_2a0._0_8_);
    }
    std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_70);
    pOVar20 = (Options *)local_2a0;
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)local_150,"class ^name^\n{\n",(char (*) [5])0x3f58c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != &local_290) {
      operator_delete((void *)local_2a0._0_8_);
    }
  }
  io::Printer::Indent((Printer *)local_150);
  io::Printer::Indent((Printer *)local_150);
  io::Printer::Print<>
            ((Printer *)local_150,
             "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
  io::Printer::Indent((Printer *)local_150);
  io::Printer::Indent((Printer *)local_150);
  local_1f0 = file;
  if (local_238->aggregate_metadata == true) {
    io::Printer::Print<>
              ((Printer *)local_150,
               "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\nif (static::$is_initialized == true) {\n  return;\n}\n"
              );
    local_220._8_8_ = &local_228;
    local_228 = (void *)((ulong)local_228 & 0xffffffff00000000);
    local_220._M_allocated_capacity = 0;
    local_208 = (_Base_ptr)0x0;
    local_1e0._24_8_ = local_1e0 + 8;
    local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffff00000000;
    local_1e0._16_8_ = (_Base_ptr)0x0;
    local_1b8 = 0;
    p_Stack_188 = (_Base_ptr)local_198;
    local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
    local_198._8_8_ = (_Base_ptr)0x0;
    local_178 = 0;
    local_210 = (_Base_ptr)local_220._8_8_;
    local_1c0 = (_Base_ptr)local_1e0._24_8_;
    local_180 = p_Stack_188;
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_b0,(Arena *)0x0,false);
    anon_unknown_2::AnalyzeDependencyForFile
              (file,(set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_1a0,
               (map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                *)local_230,
               (map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                *)local_1e0);
    if (local_178 != 0) {
      local_1f8 = &(local_238->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
      do {
        local_1e8 = *(_anonymous_namespace_ **)(p_Stack_188 + 1);
        pVar34 = std::
                 _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::equal_range((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                *)local_1a0,(key_type *)&local_1e8);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::_M_erase_aux((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)local_1a0,(_Base_ptr)pVar34.first._M_node,(_Base_ptr)pVar34.second._M_node
                      );
        pmVar11 = std::
                  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                  ::operator[]((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                                *)local_230,(key_type *)&local_1e8);
        for (p_Var13 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          local_2a0._0_8_ = *(undefined8 *)(p_Var13 + 1);
          pmVar12 = std::
                    map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                    ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                  *)local_1e0,(key_type *)local_2a0);
          if (*pmVar12 == 1) {
            pVar35 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     ::equal_range((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                    *)local_1e0,(key_type *)local_2a0);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
            ::_M_erase_aux((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                            *)local_1e0,(_Base_ptr)pVar35.first._M_node,
                           (_Base_ptr)pVar35.second._M_node);
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)local_1a0,(FileDescriptor **)local_2a0);
          }
          else {
            pmVar12 = std::
                      map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                      ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                    *)local_1e0,(key_type *)local_2a0);
            *pmVar12 = *pmVar12 + -1;
          }
        }
        if ((local_238->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
            _M_node_count == 0) {
LAB_00277ab4:
          if ((local_a0.rep_ == (Rep *)0x0) ||
             (lVar21 = (long)local_a0.current_size_,
             (local_a0.rep_)->allocated_size <= local_a0.current_size_)) {
            pFVar15 = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                                (local_a0.arena_);
            pFVar15 = (FileDescriptorProto *)
                      internal::RepeatedPtrFieldBase::AddOutOfLineHelper(&local_a0,pFVar15);
          }
          else {
            local_a0.current_size_ = local_a0.current_size_ + 1;
            pFVar15 = (FileDescriptorProto *)(local_a0.rep_)->elements[lVar21];
          }
          FileDescriptor::CopyTo((FileDescriptor *)local_1e8,pFVar15);
          pRVar4 = (pFVar15->dependency_).super_RepeatedPtrFieldBase.rep_;
          ppvVar24 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            ppvVar24 = (void **)0x0;
          }
          lVar21 = (long)(pFVar15->dependency_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar21 != 0) {
            local_78 = &pFVar15->dependency_;
            local_200 = (_anonymous_namespace_ *)kDescriptorFile_abi_cxx11_._M_string_length;
            local_1a8 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
            uVar30 = 8;
            lVar31 = -8;
            lVar26 = 0;
            do {
              __n = *(_anonymous_namespace_ **)((long)ppvVar24[lVar26] + 8);
              if ((__n != local_200) ||
                 ((__n != (_anonymous_namespace_ *)0x0 &&
                  (iVar9 = bcmp(*ppvVar24[lVar26],local_1a8,(size_t)__n), iVar9 != 0)))) {
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::DeleteSubrange(local_78,(int)lVar26,(int)(uVar30 >> 3) - (int)lVar26);
                break;
              }
              lVar26 = lVar26 + 1;
              uVar30 = uVar30 + 8;
              lVar1 = lVar21 * 8 + lVar31;
              lVar31 = lVar31 + -8;
            } while (lVar1 != 0);
          }
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                    (&(pFVar15->extension_).super_RepeatedPtrFieldBase);
          if ((pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_ != 0) {
            pRVar4 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
            ppvVar24 = pRVar4->elements;
            if (pRVar4 == (Rep *)0x0) {
              ppvVar24 = (void **)0x0;
            }
            do {
              internal::RepeatedPtrFieldBase::
              Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)((long)*ppvVar24 + 0x78));
              ppvVar24 = ppvVar24 + 1;
              pRVar4 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
              ppvVar22 = pRVar4->elements;
              if (pRVar4 == (Rep *)0x0) {
                ppvVar22 = (void **)0x0;
              }
            } while (ppvVar24 !=
                     ppvVar22 + (pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_);
          }
        }
        else {
          p_Var14 = (local_238->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          if (p_Var14 != local_1f8) {
            bVar8 = false;
            local_200 = local_1e8;
            do {
              pvVar3 = (void *)**(undefined8 **)(local_200 + 8);
              size = (_Base_ptr)(*(undefined8 **)(local_200 + 8))[1];
              if ((long)size < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)size,"string length exceeds max size");
              }
              pvVar29 = *(void **)(p_Var14 + 1);
              size_00 = p_Var14[1]._M_parent;
              if ((long)size_00 < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)size_00,"string length exceeds max size");
              }
              if (size < size_00) {
                bVar33 = false;
              }
              else {
                iVar9 = bcmp(pvVar3,pvVar29,(size_t)size_00);
                bVar33 = iVar9 == 0;
              }
              if (bVar33) {
                bVar8 = true;
                break;
              }
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
            } while (p_Var14 != local_1f8);
            if (bVar8) goto LAB_00277ab4;
          }
          local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffffff000000;
          local_290._M_allocated_capacity = local_290._M_allocated_capacity & 0xffffffff00000000;
          local_290._8_8_ = 0;
          local_280._M_allocated_capacity = (size_type)&local_290;
          local_270._M_p = (pointer)0x0;
          local_280._8_8_ = local_280._M_allocated_capacity;
          (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                    (&local_170,local_1e8,(FileDescriptor *)local_2a0,(Options *)0x0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2a0 + 8));
          anon_unknown_2::FilenameToClassname((string *)local_2a0,&local_170);
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)local_150,"\\^name^::initOnce();\n",(char (*) [5])0x3f58c9,
                     (string *)local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._0_8_ != &local_290) {
            operator_delete((void *)local_2a0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
      } while (local_178 != 0);
    }
    local_2a0._0_8_ = &local_290;
    local_2a0._8_8_ = 0;
    local_290._M_allocated_capacity = local_290._M_allocated_capacity & 0xffffffffffffff00;
    MessageLite::SerializeToString((MessageLite *)local_b0,(string *)local_2a0);
    io::Printer::Print<>((Printer *)local_150,"$pool->internalAddGeneratedFile(\n");
    io::Printer::Indent((Printer *)local_150);
    io::Printer::Indent((Printer *)local_150);
    io::Printer::Print<>((Printer *)local_150,"\'");
    uVar6 = local_2a0._8_8_;
    uVar5 = local_2a0._0_8_;
    if (local_2a0._8_8_ != 0) {
      sVar28 = 0;
      do {
        pcVar19 = "\\\'";
        if (*(char *)(uVar5 + sVar28) == '\'') {
LAB_00277daa:
          io::Printer::Print<>((Printer *)local_150,pcVar19);
        }
        else {
          if (*(char *)(uVar5 + sVar28) == '\\') {
            pcVar19 = "\\\\";
            goto LAB_00277daa;
          }
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_170,'\x01');
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)local_150,"^char^",(char (*) [5])"char",&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
        sVar28 = sVar28 + 1;
      } while (uVar6 != sVar28);
    }
    io::Printer::Print<>((Printer *)local_150,"\'\n");
    io::Printer::Outdent((Printer *)local_150);
    io::Printer::Outdent((Printer *)local_150);
    io::Printer::Print<>((Printer *)local_150,", true);\n");
    io::Printer::Print<>((Printer *)local_150,"static::$is_initialized = true;\n");
    file = local_1f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != &local_290) {
      operator_delete((void *)local_2a0._0_8_);
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_b0);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_1a0);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                 *)local_1e0);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                 *)local_230);
    goto LAB_0027835d;
  }
  io::Printer::Print<>
            ((Printer *)local_150,
             "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
            );
  if (local_238->is_descriptor == false) {
    if (0 < *(int *)(file + 0x20)) {
      iVar9 = 0;
      do {
        pFVar16 = FileDescriptor::dependency(file,iVar9);
        sVar2 = (*(undefined8 **)pFVar16)[1];
        if ((sVar2 != kDescriptorFile_abi_cxx11_._M_string_length) ||
           ((sVar2 != 0 &&
            (iVar10 = bcmp((void *)**(undefined8 **)pFVar16,
                           kDescriptorFile_abi_cxx11_._M_dataplus._M_p,sVar2), iVar10 != 0)))) {
          pFVar16 = FileDescriptor::dependency(local_1f0,iVar9);
          (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                    ((string *)local_2a0,(_anonymous_namespace_ *)pFVar16,
                     (FileDescriptor *)local_238,pOVar20);
          anon_unknown_2::FilenameToClassname((string *)local_230,(string *)local_2a0);
          pOVar20 = (Options *)local_230;
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)local_150,"\\^name^::initOnce();\n",(char (*) [5])0x3f58c9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          if (local_230 != (undefined1  [8])&local_220) {
            operator_delete((void *)local_230);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._0_8_ != &local_290) {
            operator_delete((void *)local_2a0._0_8_);
          }
        }
        iVar9 = iVar9 + 1;
        file = local_1f0;
      } while (iVar9 < *(int *)(local_1f0 + 0x20));
    }
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_2a0,(Arena *)0x0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_0027809e:
      pFVar15 = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                          ((Arena *)local_290._M_allocated_capacity);
      pFVar15 = (FileDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                          ((RepeatedPtrFieldBase *)&local_290,pFVar15);
    }
    else {
      lVar21 = (long)(int)local_290._8_4_;
      if (*(int *)local_280._M_allocated_capacity <= (int)local_290._8_4_) goto LAB_0027809e;
      local_290._8_4_ = local_290._8_4_ + 1;
      pFVar15 = *(FileDescriptorProto **)((int *)(local_280._M_allocated_capacity + 8) + lVar21 * 2)
      ;
    }
    FileDescriptor::CopyTo(file,pFVar15);
    pRVar4 = (pFVar15->dependency_).super_RepeatedPtrFieldBase.rep_;
    ppvVar24 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar24 = (void **)0x0;
    }
    lVar21 = (long)(pFVar15->dependency_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar21 != 0) {
      local_1a8 = &pFVar15->dependency_;
      local_1f8 = (_Base_ptr)kDescriptorFile_abi_cxx11_._M_string_length;
      local_200 = (_anonymous_namespace_ *)kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
      uVar30 = 8;
      lVar31 = -8;
      lVar26 = 0;
      do {
        p_Var14 = *(_Base_ptr *)((long)ppvVar24[lVar26] + 8);
        if ((p_Var14 != local_1f8) ||
           ((p_Var14 != (_Base_ptr)0x0 &&
            (iVar9 = bcmp(*ppvVar24[lVar26],local_200,(size_t)p_Var14), iVar9 != 0)))) {
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::DeleteSubrange(local_1a8,(int)lVar26,(int)(uVar30 >> 3) - (int)lVar26);
          break;
        }
        lVar26 = lVar26 + 1;
        uVar30 = uVar30 + 8;
        lVar1 = lVar21 * 8 + lVar31;
        lVar31 = lVar31 + -8;
      } while (lVar1 != 0);
    }
    internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(pFVar15->extension_).super_RepeatedPtrFieldBase);
    if ((pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_ != 0) {
      pRVar4 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
      ppvVar24 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar24 = (void **)0x0;
      }
      do {
        internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                  ((RepeatedPtrFieldBase *)((long)*ppvVar24 + 0x78));
        ppvVar24 = ppvVar24 + 1;
        pRVar4 = (pFVar15->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
      } while (ppvVar24 !=
               ppvVar22 + (pFVar15->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    local_230 = (undefined1  [8])&local_220;
    local_228 = (void *)0x0;
    local_220._M_allocated_capacity = local_220._M_allocated_capacity & 0xffffffffffffff00;
    MessageLite::SerializeToString((MessageLite *)local_2a0,(string *)local_230);
    io::Printer::Print<>((Printer *)local_150,"$pool->internalAddGeneratedFile(\n");
    io::Printer::Indent((Printer *)local_150);
    io::Printer::Indent((Printer *)local_150);
    io::Printer::Print<>((Printer *)local_150,"\'");
    pvVar3 = local_228;
    auVar7 = local_230;
    if (local_228 != (void *)0x0) {
      pvVar29 = (void *)0x0;
      do {
        pcVar19 = "\\\'";
        if (*(char *)((long)auVar7 + (long)pvVar29) == '\'') {
LAB_00278279:
          io::Printer::Print<>((Printer *)local_150,pcVar19);
        }
        else {
          if (*(char *)((long)auVar7 + (long)pvVar29) == '\\') {
            pcVar19 = "\\\\";
            goto LAB_00278279;
          }
          local_1e0._0_8_ = local_1e0 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_1e0,'\x01');
          io::Printer::Print<char[5],std::__cxx11::string>
                    ((Printer *)local_150,"^char^",(char (*) [5])"char",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_);
          }
        }
        pvVar29 = (void *)((long)pvVar29 + 1);
      } while (pvVar3 != pvVar29);
    }
    io::Printer::Print<>((Printer *)local_150,"\'\n");
    io::Printer::Outdent((Printer *)local_150);
    io::Printer::Outdent((Printer *)local_150);
    io::Printer::Print<>((Printer *)local_150,", true);\n\n");
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230);
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_2a0);
    file = local_1f0;
  }
  else {
    if (0 < *(int *)(file + 0x2c)) {
      lVar21 = 0;
      lVar26 = 0;
      do {
        local_2a0._8_8_ = 0;
        local_290._M_allocated_capacity = local_290._M_allocated_capacity & 0xffffffffffffff00;
        local_2a0._0_8_ = &local_290;
        anon_unknown_2::GenerateMessageToPool
                  ((string *)local_2a0,(Descriptor *)(*(long *)(file + 0x58) + lVar21),
                   (Printer *)local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._0_8_ != &local_290) {
          operator_delete((void *)local_2a0._0_8_);
        }
        lVar26 = lVar26 + 1;
        lVar21 = lVar21 + 0x88;
        file = local_1f0;
      } while (lVar26 < *(int *)(local_1f0 + 0x2c));
    }
    if (0 < *(int *)(file + 0x30)) {
      lVar21 = 0;
      lVar26 = 0;
      do {
        anon_unknown_2::GenerateEnumToPool
                  ((EnumDescriptor *)(*(long *)(file + 0x60) + lVar21),(Printer *)local_150);
        lVar26 = lVar26 + 1;
        lVar21 = lVar21 + 0x48;
      } while (lVar26 < *(int *)(file + 0x30));
    }
    io::Printer::Print<>((Printer *)local_150,"$pool->finish();\n");
  }
  io::Printer::Print<>((Printer *)local_150,"static::$is_initialized = true;\n");
LAB_0027835d:
  io::Printer::Outdent((Printer *)local_150);
  io::Printer::Outdent((Printer *)local_150);
  io::Printer::Print<>((Printer *)local_150,"}\n");
  io::Printer::Outdent((Printer *)local_150);
  io::Printer::Outdent((Printer *)local_150);
  io::Printer::Print<>((Printer *)local_150,"}\n\n");
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  io::Printer::~Printer((Printer *)local_150);
  desc = extraout_RDX;
  if (local_80 != (ZeroCopyOutputStream *)0x0) {
    (*local_80->_vptr_ZeroCopyOutputStream[1])();
    desc = extraout_RDX_00;
  }
  if ((_Base_ptr)local_70._32_8_ != (_Base_ptr)(local_70 + 0x30)) {
    operator_delete((void *)local_70._32_8_);
    desc = extraout_RDX_01;
  }
  options_00 = local_1b0;
  pOVar20 = local_238;
  if (0 < *(int *)((anon_unknown_2 *)file + 0x2c)) {
    lVar21 = 0;
    lVar26 = 0;
    do {
      anon_unknown_2::GenerateMessageFile
                ((anon_unknown_2 *)file,
                 (FileDescriptor *)(*(long *)((anon_unknown_2 *)file + 0x58) + lVar21),
                 (Descriptor *)pOVar20,options_00,(GeneratorContext *)pcVar27);
      lVar26 = lVar26 + 1;
      lVar21 = lVar21 + 0x88;
      desc = extraout_RDX_02;
    } while (lVar26 < *(int *)((anon_unknown_2 *)file + 0x2c));
  }
  if (0 < *(int *)((anon_unknown_2 *)file + 0x30)) {
    lVar21 = 0;
    lVar26 = 0;
    do {
      anon_unknown_2::GenerateEnumFile
                ((anon_unknown_2 *)file,
                 (FileDescriptor *)(*(long *)((anon_unknown_2 *)file + 0x60) + lVar21),
                 (EnumDescriptor *)pOVar20,options_00,(GeneratorContext *)pcVar27);
      lVar26 = lVar26 + 1;
      lVar21 = lVar21 + 0x48;
      desc = extraout_RDX_03;
    } while (lVar26 < *(int *)((anon_unknown_2 *)file + 0x30));
  }
  if (*(char *)(*(long *)((anon_unknown_2 *)file + 0x78) + 0x9e) != '\x01') {
    return true;
  }
  if (*(int *)((anon_unknown_2 *)file + 0x34) < 1) {
    return true;
  }
  local_200 = (_anonymous_namespace_ *)0x0;
  do {
    lVar21 = *(long *)(file + 0x68);
    lVar26 = (long)local_200 * 0x30;
    this_00 = (ServiceDescriptor *)(lVar21 + lVar26);
    (anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)this_00,desc);
    lVar21 = *(long *)(lVar21 + 0x10 + lVar26);
    lVar26 = *(long *)(lVar21 + 0x78);
    if ((*(byte *)(lVar26 + 0x28) & 0x80) == 0) {
      full_name = *(string **)(lVar21 + 8);
      if (full_name->_M_string_length == 0) {
LAB_00278559:
        local_2a0._0_8_ = &local_290;
        local_2a0._8_8_ = 0;
        local_290._M_allocated_capacity = local_290._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        anon_unknown_2::PhpName((string *)local_2a0,full_name,local_238);
      }
    }
    else {
      plVar17 = (long *)(*(ulong *)(lVar26 + 0x80) & 0xfffffffffffffffe);
      lVar21 = plVar17[1];
      local_2a0._0_8_ = &local_290;
      if (lVar21 == 0) goto LAB_00278559;
      lVar26 = *plVar17;
      std::__cxx11::string::_M_construct<char*>((string *)local_2a0,lVar26,lVar21 + lVar26);
    }
    pcVar32 = local_198 + 8;
    pcVar25 = local_150 + 0x10;
    if (local_2a0._8_8_ == 0) {
      if ((pointer)local_150._0_8_ == pcVar25) {
        p_Stack_188 = (_Base_ptr)local_150._24_8_;
        local_1a0 = (undefined1  [8])pcVar32;
      }
      else {
        local_1a0 = (undefined1  [8])local_150._0_8_;
      }
      local_198._9_7_ = local_150._17_7_;
      local_198[8] = local_150[0x10];
      local_198._0_8_ = local_150._8_8_;
      local_150._8_8_ = (ZeroCopyOutputStream *)0x0;
      local_150[0x10] = '\0';
      local_150._0_8_ = pcVar25;
    }
    else {
      local_230 = (undefined1  [8])&local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,local_2a0._0_8_,(char *)(local_2a0._0_8_ + local_2a0._8_8_));
      std::__cxx11::string::append((char *)local_230);
      plVar17 = (long *)std::__cxx11::string::_M_append((char *)local_230,local_150._0_8_);
      plVar23 = plVar17 + 2;
      if ((long *)*plVar17 == plVar23) {
        local_198._8_8_ = *plVar23;
        p_Stack_188 = (_Base_ptr)plVar17[3];
        local_1a0 = (undefined1  [8])pcVar32;
      }
      else {
        local_198._8_8_ = *plVar23;
        local_1a0 = (undefined1  [8])*plVar17;
      }
      local_198._0_8_ = plVar17[1];
      *plVar17 = (long)plVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != &local_290) {
      operator_delete((void *)local_2a0._0_8_);
    }
    if ((pointer)local_150._0_8_ != pcVar25) {
      operator_delete((void *)local_150._0_8_);
    }
    plVar17 = (long *)std::__cxx11::string::append(local_1a0);
    local_1e0._0_8_ = local_1e0 + 0x10;
    plVar23 = plVar17 + 2;
    if ((long *)*plVar17 == plVar23) {
      local_1e0._16_8_ = *plVar23;
      local_1e0._24_8_ = plVar17[3];
    }
    else {
      local_1e0._16_8_ = *plVar23;
      local_1e0._0_8_ = (long *)*plVar17;
    }
    local_1e0._8_8_ = plVar17[1];
    *plVar17 = (long)plVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if (local_1a0 != (undefined1  [8])pcVar32) {
      operator_delete((void *)local_1a0);
    }
    if (local_1e0._8_8_ != 0) {
      uVar30 = 0;
      do {
        if (*(char *)(local_1e0._0_8_ + uVar30) == '\\') {
          *(char *)(local_1e0._0_8_ + uVar30) = '/';
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 < (ulong)local_1e0._8_8_);
    }
    local_b0._0_8_ = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_1e0._0_8_,(pointer)(local_1e0._0_8_ + local_1e0._8_8_));
    std::__cxx11::string::append((char *)local_b0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_);
    }
    local_1f8 = (_Base_ptr)(**(code **)(*(long *)local_1b0 + 0x10))(local_1b0,local_b0);
    io::Printer::Printer((Printer *)local_150,(ZeroCopyOutputStream *)local_1f8,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)local_150,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
    anon_unknown_2::FilenameToClassname((string *)local_1e0,(string *)local_b0);
    iVar9 = std::__cxx11::string::find_last_of((char *)local_1e0,0x3e4bdf,0xffffffffffffffff);
    if (*(long *)((*(ulong *)(*(long *)(file + 0x78) + 0x80) & 0xfffffffffffffffe) + 8) == 0) {
      if ((*(byte *)(*(long *)(file + 0x78) + 0x28) & 0x80) == 0) {
        if ((iVar9 != -1) || (*(long *)(*(long *)(file + 8) + 8) != 0)) goto LAB_00278854;
      }
      else if (iVar9 != -1) goto LAB_00278854;
    }
    else {
LAB_00278854:
      std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_1e0);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)local_150,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._0_8_ != &local_290) {
        operator_delete((void *)local_2a0._0_8_);
      }
    }
    io::Printer::Print<>((Printer *)local_150,"/**\n");
    local_290._M_allocated_capacity = (size_type)&local_280;
    local_290._8_8_ = 0;
    local_280._M_allocated_capacity = local_280._M_allocated_capacity & 0xffffffffffffff00;
    local_270._M_p = local_268 + 8;
    local_268._0_8_ = 0;
    local_268[8] = '\0';
    local_250.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_250.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_250.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar8 = ServiceDescriptor::GetSourceLocation(this_00,(SourceLocation *)local_2a0);
    if (bVar8) {
      anon_unknown_2::GenerateDocCommentBodyForLocation
                ((anon_unknown_2 *)local_150,(Printer *)local_2a0,(SourceLocation *)0x1,false,
                 (int)pcVar27);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250);
    if (local_270._M_p != local_268 + 8) {
      operator_delete(local_270._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_allocated_capacity != &local_280) {
      operator_delete((void *)local_290._M_allocated_capacity);
    }
    anon_unknown_2::EscapePhpdoc((string *)local_2a0,(string *)(*(long *)(this_00 + 8) + 0x20));
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)local_150," * Protobuf type <code>^fullname^</code>\n */\n",
               (char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != &local_290) {
      operator_delete((void *)local_2a0._0_8_);
    }
    if (iVar9 == -1) {
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)local_150,"interface ^name^\n{\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    }
    else {
      std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_1e0);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)local_150,"interface ^name^\n{\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._0_8_ != &local_290) {
        operator_delete((void *)local_2a0._0_8_);
      }
    }
    io::Printer::Indent((Printer *)local_150);
    io::Printer::Indent((Printer *)local_150);
    if (0 < *(int *)(this_00 + 0x28)) {
      lVar26 = 0;
      lVar21 = 0;
      do {
        iVar9 = (int)pcVar27;
        lVar31 = *(long *)(this_00 + 0x20);
        io::Printer::Print<>((Printer *)local_150,"/**\n");
        this_01 = (MethodDescriptor *)(lVar26 + lVar31);
        local_290._M_allocated_capacity = (size_type)&local_280;
        local_290._8_8_ = 0;
        local_280._M_allocated_capacity = local_280._M_allocated_capacity & 0xffffffffffffff00;
        local_270._M_p = local_268 + 8;
        local_268._0_8_ = 0;
        local_268[8] = '\0';
        local_250.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_250.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_250.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar8 = MethodDescriptor::GetSourceLocation(this_01,(SourceLocation *)local_2a0);
        if (bVar8) {
          anon_unknown_2::GenerateDocCommentBodyForLocation
                    ((anon_unknown_2 *)local_150,(Printer *)local_2a0,(SourceLocation *)0x1,false,
                     iVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_250);
        if (local_270._M_p != local_268 + 8) {
          operator_delete(local_270._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity);
        }
        anon_unknown_2::UnderscoresToCamelCase
                  ((string *)local_230,*(string **)(lVar31 + 8 + lVar26),false);
        anon_unknown_2::EscapePhpdoc((string *)local_2a0,(string *)local_230);
        io::Printer::Print<char[12],std::__cxx11::string>
                  ((Printer *)local_150," * Method <code>^method_name^</code>\n *\n",
                   (char (*) [12])0x433c2d,(string *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._0_8_ != &local_290) {
          operator_delete((void *)local_2a0._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        pDVar18 = MethodDescriptor::input_type(this_01);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar18,is_descriptor);
        anon_unknown_2::EscapePhpdoc((string *)local_2a0,(string *)local_230);
        io::Printer::Print<char[11],std::__cxx11::string>
                  ((Printer *)local_150," * @param \\^input_type^ $request\n",
                   (char (*) [11])0x44318c,(string *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._0_8_ != &local_290) {
          operator_delete((void *)local_2a0._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        pDVar18 = MethodDescriptor::output_type(this_01);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar18,is_descriptor_00);
        anon_unknown_2::EscapePhpdoc((string *)local_2a0,(string *)local_230);
        io::Printer::Print<char[12],std::__cxx11::string>
                  ((Printer *)local_150," * @return \\^return_type^\n */\n",
                   (char (*) [12])"return_type",(string *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._0_8_ != &local_290) {
          operator_delete((void *)local_2a0._0_8_);
        }
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        anon_unknown_2::UnderscoresToCamelCase
                  ((string *)local_2a0,*(string **)(lVar31 + 8 + lVar26),false);
        pDVar18 = MethodDescriptor::input_type(this_01);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((string *)local_230,pDVar18,is_descriptor_01);
        pcVar27 = "request_name";
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  ((Printer *)local_150,
                   "public function ^camel_name^(\\^request_name^ $request);\n\n",
                   (char (*) [11])"camel_name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   (char (*) [13])"request_name",(string *)local_230);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._0_8_ != &local_290) {
          operator_delete((void *)local_2a0._0_8_);
        }
        lVar21 = lVar21 + 1;
        lVar26 = lVar26 + 0x40;
      } while (lVar21 < *(int *)(this_00 + 0x28));
    }
    io::Printer::Outdent((Printer *)local_150);
    file = local_1f0;
    io::Printer::Outdent((Printer *)local_150);
    io::Printer::Print<>((Printer *)local_150,"}\n\n");
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_);
    }
    io::Printer::~Printer((Printer *)local_150);
    desc = extraout_RDX_04;
    if (local_1f8 != (_Base_ptr)0x0) {
      (*(*(_func_int ***)local_1f8)[1])();
      desc = extraout_RDX_05;
    }
    if ((RepeatedPtrFieldBase *)local_b0._0_8_ != &local_a0) {
      operator_delete((void *)local_b0._0_8_);
      desc = extraout_RDX_06;
    }
    local_200 = (_anonymous_namespace_ *)((long)local_200 + 1);
    if ((long)*(int *)(file + 0x34) <= (long)local_200) {
      return true;
    }
  } while( true );
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const Options& options,
                         GeneratorContext* generator_context,
                         std::string* error) const {
  if (options.is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!options.is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, options, generator_context);

  return true;
}